

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O1

V2f Imf_3_4::LatLongMap::latLong(Box2i *dataWindow,V2f *pixelPosition)

{
  int iVar1;
  int iVar2;
  V2f VVar3;
  int iVar4;
  float *in_RDI;
  float fVar5;
  float fVar6;
  
  iVar1 = (dataWindow->min).y;
  iVar2 = (dataWindow->max).y;
  fVar5 = 0.0;
  fVar6 = 0.0;
  iVar4 = iVar2 - iVar1;
  if (iVar4 != 0 && iVar1 <= iVar2) {
    fVar6 = ((pixelPosition->y - (float)iVar1) / (float)iVar4 + -0.5) * -3.1415927;
  }
  iVar1 = (dataWindow->min).x;
  iVar2 = (dataWindow->max).x;
  iVar4 = iVar2 - iVar1;
  if (iVar4 != 0 && iVar1 <= iVar2) {
    fVar5 = ((pixelPosition->x - (float)iVar1) / (float)iVar4 + -0.5) * -6.2831855;
  }
  *in_RDI = fVar6;
  in_RDI[1] = fVar5;
  VVar3.y = 0.0;
  VVar3.x = fVar5;
  return VVar3;
}

Assistant:

V2f
latLong (const Box2i& dataWindow, const V2f& pixelPosition)
{
    float latitude, longitude;

    if (dataWindow.max.y > dataWindow.min.y)
    {
        latitude = -1 * float (M_PI) *
                   ((pixelPosition.y - dataWindow.min.y) /
                        (dataWindow.max.y - dataWindow.min.y) -
                    0.5f);
    }
    else { latitude = 0; }

    if (dataWindow.max.x > dataWindow.min.x)
    {
        longitude = -2 * float (M_PI) *
                    ((pixelPosition.x - dataWindow.min.x) /
                         (dataWindow.max.x - dataWindow.min.x) -
                     0.5f);
    }
    else { longitude = 0; }

    return V2f (latitude, longitude);
}